

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O0

double __thiscall ON_ShutLining::Curve::Radius(Curve *this)

{
  CImpl *this_00;
  double dVar1;
  ON_XMLVariant local_200;
  ON_XMLVariant local_108;
  Curve *local_10;
  Curve *this_local;
  
  this_00 = this->m_impl;
  local_10 = this;
  ::ON_XMLVariant::ON_XMLVariant(&local_200,1.0);
  CImpl::GetParam(&local_108,this_00,L"radius",&local_200);
  dVar1 = ::ON_XMLVariant::operator_cast_to_double(&local_108);
  ::ON_XMLVariant::~ON_XMLVariant(&local_108);
  ::ON_XMLVariant::~ON_XMLVariant(&local_200);
  return dVar1;
}

Assistant:

double ON_ShutLining::Curve::Radius(void) const
{
  return m_impl->GetParam(ON_SHUTLINING_CURVE_RADIUS, 1.0);
}